

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,size_t *offBasePtr,U32 mls,
                 ZSTD_dictMode_e dictMode)

{
  BYTE *pBVar1;
  ZSTD_dictMode_e curr_00;
  ZSTD_dictMode_e ZVar2;
  int iVar3;
  ZSTD_dictMode_e ZVar4;
  U32 nbCompares_00;
  uint uVar5;
  ZSTD_dictMode_e *pZVar6;
  size_t sVar7;
  ulong *in_RCX;
  BYTE *ip_00;
  BYTE *in_RDX;
  BYTE *in_RSI;
  ZSTD_matchState_t *in_RDI;
  int in_R8D;
  int in_R9D;
  U32 mIndex;
  BYTE *match;
  size_t matchLength;
  U32 *nextPtr;
  size_t bestLength;
  U32 dummy32;
  U32 matchEndIdx;
  U32 *largerPtr;
  U32 *smallerPtr;
  BYTE *prefixStart;
  BYTE *dictEnd;
  U32 dictLimit;
  BYTE *dictBase;
  size_t commonLengthLarger;
  size_t commonLengthSmaller;
  U32 nextCandidateIdx;
  U32 *nextCandidateIdxPtr;
  U32 previousCandidate;
  U32 nbCandidates;
  U32 nbCompares;
  U32 *unsortedMark;
  U32 *nextCandidate;
  U32 unsortLimit;
  U32 btLow;
  U32 btMask;
  U32 btLog;
  U32 *bt;
  U32 windowLow;
  U32 curr;
  BYTE *base;
  U32 matchIndex;
  size_t h;
  U32 hashLog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  U32 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  uint in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  undefined6 in_stack_fffffffffffffeb8;
  bool bVar8;
  undefined1 uVar9;
  ZSTD_dictMode_e ZVar10;
  ZSTD_dictMode_e ZVar11;
  BYTE *local_128;
  BYTE *local_120;
  BYTE *local_110;
  ZSTD_dictMode_e local_108;
  uint local_104;
  ZSTD_dictMode_e *local_100;
  ZSTD_dictMode_e *local_f8;
  BYTE *local_f0;
  BYTE *local_e8;
  uint local_dc;
  BYTE *local_d8;
  BYTE *local_d0;
  BYTE *local_c8;
  ZSTD_dictMode_e local_bc;
  ZSTD_dictMode_e *local_b8;
  ZSTD_dictMode_e ZVar12;
  ZSTD_dictMode_e *inputEnd;
  U32 nbCompares_01;
  ZSTD_dictMode_e *bestLength_00;
  ZSTD_dictMode_e ZVar13;
  ZSTD_dictMode_e ZVar14;
  U32 *ip_01;
  ZSTD_dictMode_e local_64;
  U32 mls_00;
  U32 *pUVar15;
  ZSTD_compressionParameters *pZVar16;
  size_t local_8;
  
  pZVar16 = &in_RDI->cParams;
  pUVar15 = in_RDI->hashTable;
  if (0x20 < (in_RDI->cParams).hashLog) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  ip_00 = (BYTE *)(ulong)(in_R8D - 4);
  switch(ip_00) {
  default:
    local_8 = ZSTD_hash4Ptr((void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            in_stack_fffffffffffffe8c);
    break;
  case (BYTE *)0x1:
    local_8 = ZSTD_hash5Ptr((void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            in_stack_fffffffffffffe8c);
    break;
  case (BYTE *)0x2:
    local_8 = ZSTD_hash6Ptr((void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            in_stack_fffffffffffffe8c);
    break;
  case (BYTE *)0x3:
    local_8 = ZSTD_hash7Ptr((void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            in_stack_fffffffffffffe8c);
    break;
  case (BYTE *)0x4:
    local_8 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            in_stack_fffffffffffffe8c);
  }
  local_64 = pUVar15[local_8];
  pBVar1 = (in_RDI->window).base;
  curr_00 = (int)in_RSI - (int)pBVar1;
  ZVar2 = ZSTD_getLowestMatchIndex(in_RDI,curr_00,pZVar16->windowLog);
  ip_01 = in_RDI->chainTable;
  iVar3 = pZVar16->chainLog - 1;
  ZVar4 = (1 << ((byte)iVar3 & 0x1f)) - ZSTD_extDict;
  if (ZVar4 < curr_00) {
    ZVar11 = curr_00 - ZVar4;
  }
  else {
    ZVar11 = ZSTD_noDict;
  }
  ZVar10 = ZVar2;
  if (ZVar2 < ZVar11) {
    ZVar10 = ZVar11;
  }
  nbCompares_00 = 1 << ((byte)pZVar16->searchLog & 0x1f);
  ZVar12 = ZSTD_noDict;
  if (in_RDX + 0xfffffffffffffff8 < in_RSI) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x747b,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  uVar5 = nbCompares_00;
  if (in_R9D == 3) {
    __assert_fail("dictMode != ZSTD_dedicatedDictSearch",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x747c,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  while( true ) {
    bestLength_00 = ip_01 + ((local_64 & ZVar4) << 1);
    inputEnd = ip_01 + (ulong)((local_64 & ZVar4) << 1) + 1;
    bVar8 = false;
    if ((ZVar10 < local_64) && (bVar8 = false, *inputEnd == ZSTD_extDict)) {
      bVar8 = 1 < uVar5;
    }
    if (!bVar8) break;
    *inputEnd = ZVar12;
    ZVar12 = local_64;
    uVar5 = uVar5 - 1;
    local_64 = *bestLength_00;
  }
  if ((ZVar10 < local_64) && (*inputEnd == ZSTD_extDict)) {
    *inputEnd = ZSTD_noDict;
    *bestLength_00 = ZSTD_noDict;
  }
  uVar9 = 0;
  ZVar13 = ZVar10;
  ZVar14 = ZVar11;
  local_64 = ZVar12;
  while (local_64 != ZSTD_noDict) {
    local_b8 = ip_01 + (ulong)((local_64 & ZVar4) << 1) + 1;
    local_bc = *local_b8;
    ZSTD_insertDUBT1((ZSTD_matchState_t *)CONCAT44(ZVar14,ZVar13),
                     (U32)((ulong)bestLength_00 >> 0x20),(BYTE *)inputEnd,nbCompares_00,uVar5,ZVar12
                    );
    uVar5 = uVar5 + 1;
    local_64 = local_bc;
  }
  local_c8 = (BYTE *)0x0;
  local_d0 = (BYTE *)0x0;
  local_d8 = (in_RDI->window).dictBase;
  local_dc = (in_RDI->window).dictLimit;
  local_e8 = local_d8 + local_dc;
  local_f0 = pBVar1 + local_dc;
  local_f8 = ip_01 + ((curr_00 & ZVar4) << 1);
  local_100 = ip_01 + (ulong)((curr_00 & ZVar4) << 1) + 1;
  local_104 = curr_00 + 9;
  local_110 = (BYTE *)0x0;
  local_64 = pUVar15[local_8];
  pUVar15[local_8] = curr_00;
  do {
    ZVar12 = (ZSTD_dictMode_e)pZVar16;
    mls_00 = (U32)pUVar15;
    nbCompares_01 = (U32)((ulong)inputEnd >> 0x20);
    bVar8 = nbCompares_00 != 0 && ZVar2 < local_64;
    if (nbCompares_00 == 0 || ZVar2 >= local_64) {
LAB_00377084:
      *local_100 = ZSTD_noDict;
      *local_f8 = ZSTD_noDict;
      if (0x40000000 < nbCompares_00) {
        __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x74df,
                      "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                     );
      }
      if ((in_R9D == 2) && (nbCompares_00 != 0)) {
        local_110 = (BYTE *)ZSTD_DUBT_findBetterDictMatch
                                      ((ZSTD_matchState_t *)CONCAT44(curr_00,ZVar2),(BYTE *)ip_01,
                                       (BYTE *)CONCAT44(iVar3,ZVar4),
                                       (size_t *)CONCAT44(ZVar14,ZVar13),(size_t)bestLength_00,
                                       nbCompares_01,mls_00,ZVar12);
      }
      if (curr_00 + 8 < local_104) {
        in_RDI->nextToUpdate = local_104 - 8;
        if (((BYTE *)0x2 < local_110) && (*in_RCX < 4)) {
          __assert_fail("OFFBASE_IS_OFFSET(*offBasePtr)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x74ea,
                        "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                       );
        }
        return (size_t)local_110;
      }
      __assert_fail("matchEndIdx > curr+8",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x74e7,
                    "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                   );
    }
    pZVar6 = ip_01 + ((local_64 & ZVar4) << 1);
    local_120 = local_d0;
    if (local_c8 < local_d0) {
      local_120 = local_c8;
    }
    if ((in_R9D == 1) && (local_120 + local_64 < (BYTE *)(ulong)local_dc)) {
      local_128 = local_d8 + local_64;
      sVar7 = ZSTD_count_2segments
                        (ip_00,(BYTE *)CONCAT44(ZVar11,ZVar10),
                         (BYTE *)CONCAT17(uVar9,CONCAT16(bVar8,in_stack_fffffffffffffeb8)),local_120
                         ,(BYTE *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      local_120 = local_120 + sVar7;
      if ((BYTE *)(ulong)local_dc <= local_120 + local_64) {
        local_128 = pBVar1 + local_64;
      }
    }
    else {
      local_128 = pBVar1 + local_64;
      sVar7 = ZSTD_count(ip_00,(BYTE *)CONCAT44(ZVar11,ZVar10),
                         (BYTE *)CONCAT17(uVar9,CONCAT16(bVar8,in_stack_fffffffffffffeb8)));
      local_120 = local_120 + sVar7;
    }
    if (local_110 < local_120) {
      if ((BYTE *)(ulong)(local_104 - local_64) < local_120) {
        local_104 = local_64 + (int)local_120;
      }
      in_stack_fffffffffffffeac = ((int)local_120 - (int)local_110) * 4;
      in_stack_fffffffffffffea8 = ZSTD_highbit32(0);
      uVar5 = ZSTD_highbit32(0);
      ZVar12 = (ZSTD_dictMode_e)pZVar16;
      mls_00 = (U32)pUVar15;
      nbCompares_01 = (U32)((ulong)inputEnd >> 0x20);
      if ((int)(in_stack_fffffffffffffea8 - uVar5) < in_stack_fffffffffffffeac) {
        local_110 = local_120;
        if (curr_00 == local_64) {
          __assert_fail("(curr - matchIndex)>0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x74c2,
                        "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                       );
        }
        *in_RCX = (ulong)((curr_00 - local_64) + 3);
      }
      if (in_RSI + (long)local_120 == in_RDX) {
        if (in_R9D == 2) {
          nbCompares_00 = 0;
        }
        goto LAB_00377084;
      }
    }
    ZVar12 = (ZSTD_dictMode_e)pZVar16;
    mls_00 = (U32)pUVar15;
    nbCompares_01 = (U32)((ulong)inputEnd >> 0x20);
    if (local_128[(long)local_120] < local_120[(long)in_RSI]) {
      *local_f8 = local_64;
      local_c8 = local_120;
      if (local_64 <= ZVar14) {
        local_f8 = &local_108;
        goto LAB_00377084;
      }
      local_f8 = pZVar6 + 1;
      local_64 = pZVar6[1];
    }
    else {
      *local_100 = local_64;
      local_d0 = local_120;
      if (local_64 <= ZVar14) {
        local_100 = &local_108;
        goto LAB_00377084;
      }
      local_64 = *pZVar6;
      local_100 = pZVar6;
    }
    nbCompares_00 = nbCompares_00 - 1;
  } while( true );
}

Assistant:

static size_t
ZSTD_DUBT_findBestMatch(ZSTD_matchState_t* ms,
                        const BYTE* const ip, const BYTE* const iend,
                        size_t* offBasePtr,
                        U32 const mls,
                        const ZSTD_dictMode_e dictMode)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const curr = (U32)(ip-base);
    U32    const windowLow = ZSTD_getLowestMatchIndex(ms, curr, cParams->windowLog);

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= curr) ? 0 : curr - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", curr);
    assert(ip <= iend-8);   /* required for h calculation */
    assert(dictMode != ZSTD_dedicatedDictSearch);

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;  /* the unsortedMark becomes a reversed chain, to move up back to original position */
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    /* nullify last candidate if it's still unsorted
     * simplification, detrimental to compression ratio, beneficial for speed */
    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, matchIndex, iend,
                         nbCandidates, unsortLimit, dictMode);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller = 0, commonLengthLarger = 0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(curr&btMask);
        U32* largerPtr  = bt + 2*(curr&btMask) + 1;
        U32 matchEndIdx = curr + 8 + 1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = curr;   /* Update Hash Table */

        for (; nbCompares && (matchIndex > windowLow); --nbCompares) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((dictMode != ZSTD_extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(curr - matchIndex + 1) - ZSTD_highbit32((U32)*offBasePtr)) )
                    bestLength = matchLength, *offBasePtr = OFFSET_TO_OFFBASE(curr - matchIndex);
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    if (dictMode == ZSTD_dictMatchState) {
                        nbCompares = 0; /* in addition to avoiding checking any
                                         * further in this loop, make sure we
                                         * skip checking in the dictionary. */
                    }
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        assert(nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)); /* Check we haven't underflowed. */
        if (dictMode == ZSTD_dictMatchState && nbCompares) {
            bestLength = ZSTD_DUBT_findBetterDictMatch(
                    ms, ip, iend,
                    offBasePtr, bestLength, nbCompares,
                    mls, dictMode);
        }

        assert(matchEndIdx > curr+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = curr - (U32)OFFBASE_TO_OFFSET(*offBasePtr); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        curr, (U32)bestLength, (U32)*offBasePtr, mIndex);
        }
        return bestLength;
    }
}